

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

exr_result_t exr_write_header(exr_context_t ctxt)

{
  _internal_exr_part *curpart;
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  int32_t val;
  exr_result_t eVar5;
  ulong uVar6;
  
  if (ctxt == (exr_context_t)0x0) {
    iVar4 = 2;
  }
  else {
    if (*ctxt != (_priv_exr_context_t)0x1) {
      eVar5 = (**(code **)(ctxt + 0x38))(ctxt,8);
      return eVar5;
    }
    if (*(int *)(ctxt + 0xc4) == 0) {
      eVar5 = (**(code **)(ctxt + 0x40))(ctxt,6,"No parts defined in file prior to writing data");
      return eVar5;
    }
    uVar6 = 0;
    iVar4 = 0;
    while (iVar4 == 0) {
      if ((long)*(int *)(ctxt + 0xc4) <= (long)uVar6) {
        *(undefined8 *)(ctxt + 0xb0) = 0;
        eVar5 = internal_exr_write_header((_internal_exr_context *)ctxt);
        if (eVar5 != 0) {
          return eVar5;
        }
        *ctxt = (_priv_exr_context_t)0x3;
        *(undefined8 *)(ctxt + 0xb8) = 0xffffffff00000000;
        *(undefined4 *)(ctxt + 0xc0) = 0;
        uVar3 = *(uint *)(ctxt + 0xc4);
        if ((int)*(uint *)(ctxt + 0xc4) < 1) {
          uVar3 = 0;
        }
        for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
          lVar1 = *(long *)(ctxt + 0xb0);
          lVar2 = *(long *)(*(long *)(ctxt + 0x1d8) + uVar6 * 8);
          *(long *)(lVar2 + 0xf8) = lVar1;
          *(long *)(ctxt + 0xb0) = lVar1 + (long)*(int *)(lVar2 + 0xf4) * 8;
        }
        return 0;
      }
      curpart = *(_internal_exr_part **)(*(long *)(ctxt + 0x1d8) + uVar6 * 8);
      if (curpart->channels == (exr_attribute_t *)0x0) {
        eVar5 = (**(code **)(ctxt + 0x48))
                          (ctxt,0xd,"Part %d is missing channel list",uVar6 & 0xffffffff,
                           *(code **)(ctxt + 0x48));
        return eVar5;
      }
      iVar4 = internal_exr_compute_tile_information((_internal_exr_context *)ctxt,curpart,0);
      if (iVar4 != 0) break;
      val = internal_exr_compute_chunk_offset_size(curpart);
      curpart->chunk_count = val;
      if (((ctxt[4] != (_priv_exr_context_t)0x0) || (ctxt[5] != (_priv_exr_context_t)0x0)) &&
         (iVar4 = exr_attr_set_int(ctxt,(int)uVar6,"chunkCount",val), iVar4 != 0)) break;
      iVar4 = internal_exr_validate_write_part((_internal_exr_context *)ctxt,curpart);
      uVar6 = uVar6 + 1;
    }
    *(undefined8 *)(ctxt + 0xb0) = 0;
  }
  return iVar4;
}

Assistant:

exr_result_t
exr_write_header (exr_context_t ctxt)
{
    exr_result_t rv = EXR_ERR_SUCCESS;
    EXR_PROMOTE_LOCKED_CONTEXT_OR_ERROR (ctxt);

    if (pctxt->mode != EXR_CONTEXT_WRITE)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));

    if (pctxt->num_parts == 0)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->report_error (
            pctxt,
            EXR_ERR_FILE_BAD_HEADER,
            "No parts defined in file prior to writing data"));

    for (int p = 0; rv == EXR_ERR_SUCCESS && p < pctxt->num_parts; ++p)
    {
        struct _internal_exr_part* curp = pctxt->parts[p];

        int32_t ccount = 0;

        if (!curp->channels)
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_MISSING_REQ_ATTR,
                "Part %d is missing channel list",
                p));

        rv = internal_exr_compute_tile_information (pctxt, curp, 0);
        if (rv != EXR_ERR_SUCCESS) break;

        ccount = internal_exr_compute_chunk_offset_size (curp);

        curp->chunk_count = ccount;

        if (pctxt->has_nonimage_data || pctxt->is_multipart)
        {
            EXR_UNLOCK (pctxt);
            rv = exr_attr_set_int (ctxt, p, EXR_REQ_CHUNK_COUNT_STR, ccount);
            EXR_LOCK (pctxt);
            if (rv != EXR_ERR_SUCCESS) break;
        }

        rv = internal_exr_validate_write_part (pctxt, curp);
    }

    pctxt->output_file_offset = 0;

    if (rv == EXR_ERR_SUCCESS) rv = internal_exr_write_header (pctxt);

    if (rv == EXR_ERR_SUCCESS)
    {
        pctxt->mode               = EXR_CONTEXT_WRITING_DATA;
        pctxt->cur_output_part    = 0;
        pctxt->last_output_chunk  = -1;
        pctxt->output_chunk_count = 0;
        for (int p = 0; rv == EXR_ERR_SUCCESS && p < pctxt->num_parts; ++p)
        {
            struct _internal_exr_part* curp = pctxt->parts[p];
            curp->chunk_table_offset        = pctxt->output_file_offset;
            pctxt->output_file_offset +=
                (uint64_t) (curp->chunk_count) * sizeof (uint64_t);
        }
    }

    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}